

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *arena;
  Message *prototype;
  Message *pMVar1;
  Message *extraout_RDX;
  Message *extraout_RDX_00;
  long lVar2;
  ulong uVar3;
  
  pMVar1 = (Message *)other_elems;
  if (already_allocated < length) {
    arena = this->arena_;
    prototype = (Message *)*other_elems;
    lVar2 = 0;
    do {
      pMVar1 = GenericTypeHandler<google::protobuf::Message>::NewFromPrototype(prototype,arena);
      our_elems[already_allocated + lVar2] = pMVar1;
      lVar2 = lVar2 + 1;
      pMVar1 = extraout_RDX;
    } while (length - already_allocated != (int)lVar2);
  }
  if (0 < length) {
    uVar3 = 0;
    do {
      GenericTypeHandler<google::protobuf::Message>::Merge
                ((GenericTypeHandler<google::protobuf::Message> *)other_elems[uVar3],
                 (Message *)our_elems[uVar3],pMVar1);
      uVar3 = uVar3 + 1;
      pMVar1 = extraout_RDX_00;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  if (already_allocated < length) {
    Arena* arena = GetArena();
    typename TypeHandler::Type* elem_prototype =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[0]);
    for (int i = already_allocated; i < length; i++) {
      // Allocate a new empty element that we'll merge into below
      typename TypeHandler::Type* new_elem =
          TypeHandler::NewFromPrototype(elem_prototype, arena);
      our_elems[i] = new_elem;
    }
  }
  // Main loop that does the actual merging
  for (int i = 0; i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
}